

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.h
# Opt level: O0

void __thiscall hwnet::Poller::Poller(Poller *this)

{
  Poller *this_local;
  
  std::atomic<bool>::atomic(&this->running,false);
  std::atomic<bool>::atomic(&this->inited,false);
  std::mutex::mutex(&this->mtx);
  std::
  unordered_map<int,_std::shared_ptr<hwnet::Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>_>
  ::unordered_map(&this->channels);
  Epoll::Epoll(&this->poller_);
  std::shared_ptr<hwnet::Poller::notifyChannel>::shared_ptr(&this->notifyChannel_);
  std::__cxx11::
  list<std::shared_ptr<hwnet::Channel>,_std::allocator<std::shared_ptr<hwnet::Channel>_>_>::list
            (&this->waitRemove);
  std::atomic<bool>::atomic(&this->closed,false);
  util::TimerRoutine::TimerRoutine(&this->timerRoutine,1);
  std::atomic<int>::atomic(&this->clearWaitRemove,0);
  return;
}

Assistant:

Poller():running(false),inited(false),closed(false),timerRoutine(util::TimerMgr::normal),clearWaitRemove(0){}